

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::setPlayerStrategy(Player *this,Strategies strat)

{
  PlayerStrategy *this_00;
  
  this_00 = (PlayerStrategy *)operator_new(0x40);
  switch(strat) {
  case HUMAN_PLAYER:
    HumanPlayerStrategy::HumanPlayerStrategy((HumanPlayerStrategy *)this_00,this);
    break;
  case AGGRESSIVE_BOT:
    AggressiveBotStrategy::AggressiveBotStrategy((AggressiveBotStrategy *)this_00,this);
    break;
  case BENEVOLENT_BOT:
    BenevolentBotStrategy::BenevolentBotStrategy((BenevolentBotStrategy *)this_00,this);
    break;
  case RANDOM_BOT:
    RandomBotStrategy::RandomBotStrategy((RandomBotStrategy *)this_00,this);
    break;
  case CHEATER_BOT:
    CheaterBotStrategy::CheaterBotStrategy((CheaterBotStrategy *)this_00,this);
    break;
  default:
    HumanPlayerStrategy::HumanPlayerStrategy((HumanPlayerStrategy *)this_00,this);
  }
  this->strategy = this_00;
  return;
}

Assistant:

void Player::setPlayerStrategy(Strategies strat) {
    switch (strat) {
        case Strategies::AGGRESSIVE_BOT: {
            this->strategy = new AggressiveBotStrategy(this);
        } break;
        case Strategies::BENEVOLENT_BOT: {
            this->strategy = new BenevolentBotStrategy(this);
        } break;
        case Strategies::RANDOM_BOT: {
            this->strategy = new RandomBotStrategy(this);
        } break;
        case Strategies::HUMAN_PLAYER: {
            this->strategy = new HumanPlayerStrategy(this);
        } break;
        case Strategies::CHEATER_BOT: {
            this->strategy = new CheaterBotStrategy(this);
        } break;
        default: {
            this->strategy = new HumanPlayerStrategy(this);
        }
    }
}